

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::adjust_spec_diffusion_fluxes(PeleLM *this,MultiFab **flux,MultiFab *S,BCRec *bc)

{
  ostringstream *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  EBCellFlagFab *this_01;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer pBVar10;
  pointer pBVar11;
  int iVar12;
  int iVar13;
  undefined8 uVar14;
  Long LVar15;
  Long LVar16;
  Long LVar17;
  Long LVar18;
  Long LVar19;
  Long LVar20;
  FabType FVar21;
  uint uVar22;
  BoxArray *pBVar23;
  int *piVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int *piVar29;
  double *pdVar30;
  ostream *poVar31;
  long lVar32;
  long lVar33;
  double *pdVar34;
  long lVar35;
  ulong uVar36;
  long lVar37;
  double *pdVar38;
  double *pdVar39;
  int n;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  uint uVar44;
  int iVar45;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *__return_storage_ptr__;
  long lVar46;
  ulong uVar47;
  undefined8 *puVar48;
  long lVar49;
  long lVar50;
  FabArray<amrex::FArrayBox> *this_02;
  bool bVar51;
  double dVar52;
  double dVar53;
  undefined1 auVar54 [16];
  double dVar56;
  double dVar57;
  int id_l [3];
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  long local_9b0;
  double *local_9a8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_998;
  long local_980;
  ulong local_978;
  double *local_970;
  long local_968;
  long local_960;
  Box local_954;
  FabArray<amrex::FArrayBox> *local_938;
  long local_930;
  long local_928;
  long local_920;
  ulong local_918;
  int *local_910;
  ulong local_908;
  long local_900;
  double *local_8f8;
  long local_8f0;
  uint local_8e4;
  int local_8e0;
  int local_8dc [3];
  long *local_8d0;
  BCRec *local_8c8;
  long local_8c0;
  Box bx;
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  undefined8 local_7b8;
  Box result;
  int local_780;
  int iStack_77c;
  int local_740;
  int iStack_73c;
  long local_720;
  undefined8 uStack_718;
  long local_710;
  undefined4 uStack_708;
  int aiStack_704 [9];
  long local_6e0;
  long lStack_6d8;
  int local_6c0;
  int local_6bc;
  int local_6b8;
  int aiStack_6a0 [4];
  int iStack_690;
  int iStack_68c;
  IndexType IStack_688;
  undefined1 local_684 [6] [16];
  int id_h [3];
  undefined4 uStack_60c;
  long local_608;
  Dim3 local_5f8;
  int id_l_1 [3];
  undefined4 uStack_5cc;
  long local_5c8;
  long lStack_5c0;
  long local_5b8;
  int iStack_5b0;
  int iStack_5ac;
  int iStack_5a8;
  undefined8 uStack_5a4;
  Array4<double> local_598;
  Array4<const_double> local_558;
  MFIter mfi;
  undefined1 local_4b8 [384];
  MultiFab local_338;
  MultiFab local_1b8;
  long lVar55;
  
  local_8c8 = bc;
  dVar52 = amrex::ParallelDescriptor::second();
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0xd8);
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
       super__Vector_impl_data._M_start + 9;
  lVar32 = 0;
  do {
    puVar48 = (undefined8 *)
              ((long)(local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start)->bc + lVar32);
    *puVar48 = 0xfffffd66fffffd66;
    puVar48[1] = 0xfffffd66fffffd66;
    *(undefined8 *)
     ((long)(local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start)->bc + lVar32 + 0x10) = 0xfffffd66fffffd66;
    lVar32 = lVar32 + 0x18;
  } while (lVar32 != 0xd8);
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
              super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
              super__Vector_impl_data._M_start + 9;
  __return_storage_ptr__ = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_4b8;
  NavierStokesBase::fetchBCArray
            (__return_storage_ptr__,&this->super_NavierStokesBase,0,first_spec,9);
  pBVar11 = local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pBVar10 = local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
            super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_4b8._0_8_;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_4b8._8_8_;
  local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
  super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_4b8._16_8_;
  local_4b8._0_16_ = (undefined1  [16])0x0;
  local_4b8._16_8_ = (pointer)0x0;
  if (pBVar10 != (pointer)0x0) {
    operator_delete(pBVar10,(long)pBVar11 - (long)pBVar10);
  }
  local_938 = &S->super_FabArray<amrex::FArrayBox>;
  if ((pointer)local_4b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_4b8._0_8_,local_4b8._16_8_ - local_4b8._0_8_);
  }
  lVar32 = 0;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)(local_4b8 + lVar32));
    lVar32 = lVar32 + 0x180;
  } while (lVar32 != 0x480);
  lVar32 = 0;
  do {
    pBVar23 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)this,(int)lVar32);
    result.smallend.vect[1] = 0;
    result.smallend.vect[0] = 1;
    result.btype.itype = 0;
    result.smallend.vect[2] = 0;
    result.bigend.vect[0] = 0;
    result.bigend.vect[1] = 0;
    result.bigend.vect[2] = 0;
    (**(code **)(((__return_storage_ptr__->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>
                  ).super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                  super__Vector_impl_data._M_start)->bc + 4))
              (__return_storage_ptr__,pBVar23,&(this->super_NavierStokesBase).super_AmrLevel.dmap,9,
               4,&result,
               (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(result.bigend.vect + 1));
    this_02 = local_938;
    lVar32 = lVar32 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 0x10;
  } while (lVar32 != 3);
  amrex::EB_interp_CellCentroid_to_FaceCentroid
            ((MultiFab *)local_938,(MultiFab *)local_4b8,&local_338,&local_1b8,1,0,9,
             &(this->super_NavierStokesBase).super_AmrLevel.geom,&local_998);
  amrex::MFIter::MFIter(&mfi,&this_02->super_FabArrayBase,true);
  if (mfi.currentIndex < mfi.endIndex) {
    local_8d0 = &local_720;
    lVar32 = 0;
    do {
      do {
        uVar44 = (uint)lVar32;
        amrex::MFIter::nodaltilebox(&local_954,&mfi,uVar44);
        uVar5 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect + 2);
        uVar6 = *(undefined8 *)
                 ((this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect + 2);
        bx.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)
                           (this->super_NavierStokesBase).super_AmrLevel.geom.domain.bigend.vect >>
                  0x20);
        bx.bigend.vect[2] = (int)uVar6;
        bx.btype.itype = SUB84(uVar6,4);
        uVar14 = bx._20_8_;
        bx.smallend.vect._0_8_ =
             *(undefined8 *)(this->super_NavierStokesBase).super_AmrLevel.geom.domain.smallend.vect;
        bx.smallend.vect[2] = (int)uVar5;
        bx.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
        bx.btype.itype = SUB84(uVar6,4);
        uVar22 = bx.btype.itype >> (uVar44 & 0x1f);
        bx._20_8_ = uVar14;
        if ((uVar22 & 1) == 0) {
          piVar24 = bx.bigend.vect + lVar32;
          *piVar24 = *piVar24 + 1;
          bx.btype.itype = bx.btype.itype | 1 << ((byte)lVar32 & 0x1f);
        }
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_558,this_02,&mfi,1);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_598,&flux[lVar32]->super_FabArray<amrex::FArrayBox>,&mfi);
        piVar24 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar24 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        this_01 = (EBCellFlagFab *)
                  (this_02->m_fabs_v).
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[*piVar24][1].super_BaseFab<double>.
                  _vptr_BaseFab;
        result.bigend.vect[1] = local_954.bigend.vect[1];
        result.bigend.vect[2] = local_954.bigend.vect[2];
        result.btype.itype = local_954.btype.itype;
        result.smallend.vect[0] = local_954.smallend.vect[0];
        result.smallend.vect[1] = local_954.smallend.vect[1];
        result.smallend.vect[2] = local_954.smallend.vect[2];
        result.bigend.vect[0] = local_954.bigend.vect[0];
        FVar21 = amrex::EBCellFlagFab::getType(this_01,&result);
        if (FVar21 != covered) {
          result.smallend.vect[0] = local_954.smallend.vect[0] + -4;
          result.smallend.vect[1] = local_954.smallend.vect[1] + -4;
          result.smallend.vect[2] = local_954.smallend.vect[2] - 4;
          result.bigend.vect[0] = local_954.bigend.vect[0] + 4;
          result.bigend.vect[1] = local_954.bigend.vect[1] + 4;
          result.bigend.vect[2] = local_954.bigend.vect[2] + 4;
          FVar21 = amrex::EBCellFlagFab::getType(this_01,&result);
          iVar13 = local_558.begin.z;
          uVar5 = local_558.begin._0_8_;
          LVar20 = local_558.nstride;
          LVar19 = local_558.kstride;
          LVar18 = local_558.jstride;
          pdVar30 = local_558.p;
          iVar12 = local_598.begin.z;
          LVar17 = local_598.nstride;
          LVar16 = local_598.kstride;
          LVar15 = local_598.jstride;
          pdVar39 = local_598.p;
          if (FVar21 == regular) {
            result.smallend.vect[0] = uVar44;
            result.btype.itype = (uint)local_558.kstride;
            result.smallend.vect[2] = (int)local_558.p;
            result.bigend.vect[0] = (int)((ulong)local_558.p >> 0x20);
            result.bigend.vect[1] = (int)local_558.jstride;
            result.bigend.vect[2] = (int)((ulong)local_558.jstride >> 0x20);
            local_740 = local_598.begin.x;
            iStack_73c = local_598.begin.y;
            *(ulong *)((long)local_8d0 + 0xc) = CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]);
            *(undefined8 *)((long)local_8d0 + 0x14) = bx._20_8_;
            *local_8d0 = bx.smallend.vect._0_8_;
            local_8d0[1] = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]);
            aiStack_704._16_8_ = *(undefined8 *)(local_8c8->bc + 4);
            aiStack_704[0] = (int)*(undefined8 *)local_8c8->bc;
            aiStack_704[1] = (int)((ulong)*(undefined8 *)local_8c8->bc >> 0x20);
            aiStack_704._8_8_ = *(undefined8 *)(local_8c8->bc + 2);
            local_970 = (double *)CONCAT44(local_970._4_4_,local_954.bigend.vect[2]);
            this_02 = local_938;
            if (local_954.smallend.vect[2] <= local_954.bigend.vect[2]) {
              local_918 = (ulong)(uint)local_954.bigend.vect[0];
              local_978 = (ulong)(uint)local_954.bigend.vect[1];
              local_920 = CONCAT44(local_920._4_4_,local_954.bigend.vect[1] + 1U);
              local_780 = (int)uVar5;
              local_8f8 = pdVar30 + -(long)local_780;
              local_968 = (long)local_954.smallend.vect[0];
              local_900 = LVar18 * 8;
              local_960 = LVar19 * 8;
              local_930 = ((long)local_954.smallend.vect[1] - (long)iStack_73c) * LVar15 * 8 +
                          (long)local_954.smallend.vect[0] * 8 + (long)local_740 * -8 +
                          (long)pdVar39;
              local_928 = LVar16 * 8;
              local_980 = -(long)iVar12;
              piVar24 = id_l_1 + lVar32;
              local_910 = id_h + lVar32;
              iStack_77c = SUB84(uVar5,4);
              local_908 = (long)iStack_77c;
              uVar22 = local_954.smallend.vect[2];
              do {
                if (local_954.smallend.vect[1] <= local_954.bigend.vect[1]) {
                  local_9a8 = (double *)
                              (((long)(int)uVar22 + -(long)iVar12) * LVar16 * 8 + local_930);
                  lVar43 = (long)local_954.smallend.vect[1];
                  do {
                    if (local_954.smallend.vect[0] <= local_954.bigend.vect[0]) {
                      iVar2 = aiStack_704[lVar32];
                      iVar3 = aiStack_704[lVar32 + 3];
                      local_8f0 = CONCAT44(local_8f0._4_4_,iVar3);
                      pdVar39 = local_9a8;
                      lVar41 = local_968;
                      do {
                        id_l[0] = (int)lVar41;
                        id_l[1] = (int)lVar43;
                        id_l[2] = uVar22;
                        if (iVar2 == 3) {
                          bVar51 = id_l[lVar32] <= *(int *)((long)&local_720 + lVar32 * 4);
                        }
                        else {
                          bVar51 = false;
                        }
                        if (iVar3 == 3) {
                          bVar4 = *(int *)((long)&uStack_718 + lVar32 * 4 + 4) <= id_l[lVar32];
                        }
                        else {
                          bVar4 = false;
                        }
                        id_l_1[0] = id_l[0];
                        id_l_1[1] = id_l[1];
                        id_l_1[2] = uVar22;
                        id_h[0] = id_l[0];
                        id_h[1] = id_l[1];
                        id_h[2] = uVar22;
                        if (bVar51) {
                          *piVar24 = *piVar24 + -1;
                          piVar29 = local_910;
LAB_001a6f31:
                          *piVar29 = *piVar29 + -1;
                        }
                        else {
                          piVar29 = piVar24;
                          if (!bVar4) goto LAB_001a6f31;
                        }
                        local_7c8 = (undefined1  [16])0x0;
                        local_7d8 = (undefined1  [16])0x0;
                        local_7e8 = (undefined1  [16])0x0;
                        local_7f8 = (undefined1  [16])0x0;
                        local_7b8 = 0;
                        dVar56 = 0.0;
                        lVar42 = 0;
                        dVar53 = 0.0;
                        pdVar30 = pdVar39;
                        pdVar34 = local_8f8;
                        do {
                          dVar53 = dVar53 + *pdVar30;
                          dVar57 = (*(double *)
                                     ((long)pdVar34 +
                                     (id_l_1[2] - iVar13) * local_960 +
                                     (id_l_1[1] - iStack_77c) * local_900 + (long)id_l_1[0] * 8) +
                                   *(double *)
                                    ((long)pdVar34 +
                                    (long)id_l[0] * 8 +
                                    ((long)(int)uVar22 - (long)iVar13) * local_960 +
                                    ((long)id_l[1] - (long)iStack_77c) * local_900)) * 0.5;
                          *(double *)(local_7f8 + lVar42 * 8) = dVar57;
                          dVar56 = dVar56 + dVar57;
                          lVar42 = lVar42 + 1;
                          pdVar34 = pdVar34 + LVar20;
                          pdVar30 = pdVar30 + LVar17;
                        } while (lVar42 != 9);
                        lVar42 = 0;
                        pdVar30 = pdVar39;
                        do {
                          *pdVar30 = *(double *)(local_7f8 + lVar42 * 8) * -dVar53 * (1.0 / dVar56)
                                     + *pdVar30;
                          lVar42 = lVar42 + 1;
                          pdVar30 = pdVar30 + LVar17;
                        } while (lVar42 != 9);
                        lVar41 = lVar41 + 1;
                        pdVar39 = pdVar39 + 1;
                      } while (local_954.bigend.vect[0] + 1U != (int)lVar41);
                    }
                    lVar43 = lVar43 + 1;
                    local_9a8 = local_9a8 + LVar15;
                  } while (local_954.bigend.vect[1] + 1U != (int)lVar43);
                }
                bVar51 = uVar22 != local_954.bigend.vect[2];
                uVar22 = uVar22 + 1;
              } while (bVar51);
            }
          }
          else {
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)id_l_1,
                       (FabArray<amrex::FArrayBox> *)(local_4b8 + lVar32 * 0x180),&mfi);
            amrex::MultiCutFab::array
                      ((Array4<const_double> *)id_h,
                       (this->super_NavierStokesBase).areafrac._M_elems[lVar32],&mfi);
            iVar3 = local_558.begin.z;
            uVar5 = local_558.begin._0_8_;
            LVar20 = local_558.nstride;
            LVar19 = local_558.kstride;
            LVar18 = local_558.jstride;
            pdVar30 = local_558.p;
            iVar2 = local_598.begin.z;
            LVar17 = local_598.nstride;
            LVar16 = local_598.kstride;
            LVar15 = local_598.jstride;
            pdVar39 = local_598.p;
            iVar13 = local_954.bigend.vect[1];
            iVar12 = local_954.bigend.vect[0];
            auVar9 = _DAT_006979c0;
            auVar8 = _DAT_006979b0;
            result.smallend.vect[0] = uVar44;
            result.btype.itype = (uint)local_558.kstride;
            result.smallend.vect[2] = (int)local_558.p;
            result.bigend.vect[0] = (int)((ulong)local_558.p >> 0x20);
            result.bigend.vect[1] = (int)local_558.jstride;
            result.bigend.vect[2] = (int)((ulong)local_558.jstride >> 0x20);
            local_740 = local_598.begin.x;
            iStack_73c = local_598.begin.y;
            lVar43 = CONCAT44(id_l_1[1],id_l_1[0]);
            lVar41 = CONCAT44(uStack_5cc,id_l_1[2]);
            *(ulong *)((long)local_8d0 + 0x2c) = CONCAT44(iStack_5a8,iStack_5ac);
            *(undefined8 *)((long)local_8d0 + 0x34) = uStack_5a4;
            local_8d0[4] = local_5b8;
            local_8d0[5] = CONCAT44(iStack_5ac,iStack_5b0);
            local_8d0[2] = local_5c8;
            local_8d0[3] = lStack_5c0;
            *local_8d0 = lVar43;
            local_8d0[1] = lVar41;
            lVar43 = CONCAT44(id_h[1],id_h[0]);
            lVar41 = CONCAT44(uStack_60c,id_h[2]);
            local_6e0 = lVar43;
            lStack_6d8 = lVar41;
            iStack_690 = bx.bigend.vect[1];
            iStack_68c = bx.bigend.vect[2];
            IStack_688.itype = bx.btype.itype;
            aiStack_6a0[0] = bx.smallend.vect[0];
            aiStack_6a0[1] = bx.smallend.vect[1];
            aiStack_6a0[2] = bx.smallend.vect[2];
            aiStack_6a0[3] = bx.bigend.vect[0];
            local_684[1]._0_8_ = *(undefined8 *)(local_8c8->bc + 4);
            local_684[0] = *(undefined1 (*) [16])local_8c8->bc;
            local_8e4 = local_954.bigend.vect[2];
            this_02 = local_938;
            if (local_954.smallend.vect[2] <= local_954.bigend.vect[2]) {
              lVar37 = (long)local_954.smallend.vect[1];
              lVar49 = (long)local_954.smallend.vect[0];
              local_780 = (int)uVar5;
              iStack_77c = SUB84(uVar5,4);
              local_930 = LVar15 * 8;
              lVar42 = (lVar37 - iStack_73c) * LVar15 * 8 + lVar49 * 8;
              local_910 = (int *)(long)iStack_77c;
              local_960 = LVar18 * 8;
              local_8c0 = lVar37;
              local_928 = uStack_718 * 8;
              local_980 = lVar49;
              local_968 = (long)iVar3;
              lVar33 = (lVar37 - aiStack_704[2]) * uStack_718 * 8 + lVar49 * 8 +
                       (long)aiStack_704[1] * -8 + local_720;
              lVar25 = local_710 * 8;
              lVar26 = (long)aiStack_704[3];
              lVar7 = CONCAT44(aiStack_704[0],uStack_708);
              iVar45 = local_954.bigend.vect[0] + 1;
              local_8e0 = local_954.bigend.vect[1] + 1;
              local_6c0 = local_5f8.x;
              lVar46 = (long)local_6c0;
              local_6bc = local_5f8.y;
              local_6b8 = local_5f8.z;
              local_918 = CONCAT44(local_918._4_4_,iVar45);
              local_920 = lVar46;
              uVar22 = local_954.smallend.vect[2];
              do {
                uVar47 = (ulong)uVar22;
                uVar44 = uVar22;
                if ((int)local_8c0 <= iVar13) {
                  lVar27 = (long)(int)uVar22;
                  local_9b0 = (long)pdVar30 +
                              (lVar27 - iVar3) * LVar19 * 8 +
                              (lVar37 - iStack_77c) * LVar18 * 8 + lVar49 * 8 + (long)local_780 * -8
                  ;
                  local_9c0 = (undefined8 *)((lVar27 - lVar26) * lVar25 + lVar33);
                  lVar35 = (lVar27 - iVar2) * LVar16 * 8;
                  local_978 = (long)pdVar39 + lVar35 + lVar42 + LVar17 * 8 + (long)local_740 * -8;
                  local_970 = (double *)((long)pdVar39 + lVar35 + lVar42 + (long)local_740 * -8);
                  local_908 = uVar47;
                  lVar35 = local_8c0;
                  do {
                    if ((int)local_980 <= iVar12) {
                      iVar1 = *(int *)(local_684[0] + lVar32 * 4);
                      local_8f8 = (double *)
                                  CONCAT44(local_8f8._4_4_,
                                           *(undefined4 *)(local_684[0] + lVar32 * 4 + 0xc));
                      local_900 = lVar43 + (lVar27 - local_6b8) * local_608 * 8 +
                                  (lVar35 - local_6bc) * lVar41 * 8;
                      local_9b8 = local_9c0;
                      local_8f0 = lVar35;
                      lVar28 = local_980;
                      pdVar34 = local_970;
                      uVar36 = local_978;
                      lVar50 = local_9b0;
                      do {
                        local_8dc[0] = (int)lVar28;
                        local_8dc[1] = (int)local_8f0;
                        local_8dc[2] = (int)uVar47;
                        if (iVar1 == 3) {
                          bVar51 = local_8dc[lVar32] <= aiStack_6a0[lVar32];
                        }
                        else {
                          bVar51 = false;
                        }
                        if ((int)local_8f8 == 3) {
                          bVar4 = aiStack_6a0[lVar32 + 3] <= local_8dc[lVar32];
                        }
                        else {
                          bVar4 = false;
                        }
                        id_l[0] = (int)lVar28;
                        id_l[1] = (int)local_8f0;
                        id_l[2] = (int)uVar47;
                        id_l[lVar32] = id_l[lVar32] + -1;
                        if (*(double *)(local_900 + (lVar28 - lVar46) * 8) <= 0.0) {
                          lVar35 = 10;
                          lVar40 = 0;
                          auVar54 = auVar8;
                          do {
                            if (SUB164(auVar54 ^ auVar9,4) == -0x80000000 &&
                                SUB164(auVar54 ^ auVar9,0) < -0x7ffffff7) {
                              *(undefined8 *)((long)pdVar34 + lVar40) = 0;
                              *(undefined8 *)(uVar36 + lVar40) = 0;
                            }
                            lVar55 = auVar54._8_8_;
                            auVar54._0_8_ = auVar54._0_8_ + 2;
                            auVar54._8_8_ = lVar55 + 2;
                            lVar40 = lVar40 + LVar17 * 0x10;
                            lVar35 = lVar35 + -2;
                          } while (lVar35 != 0);
                        }
                        else {
                          local_7c8 = ZEXT816(0);
                          local_7d8 = ZEXT816(0);
                          local_7e8 = ZEXT816(0);
                          local_7f8 = ZEXT816(0);
                          local_7b8 = 0;
                          dVar56 = 0.0;
                          lVar35 = 0;
                          lVar46 = 0;
                          dVar53 = 0.0;
                          pdVar38 = pdVar34;
                          puVar48 = local_9b8;
                          do {
                            dVar53 = dVar53 + *pdVar38;
                            *(undefined8 *)(local_7f8 + lVar46 * 8) = *puVar48;
                            if (bVar51) {
                              *(undefined8 *)(local_7f8 + lVar46 * 8) =
                                   *(undefined8 *)
                                    ((long)pdVar30 +
                                    lVar35 * 8 +
                                    (long)(id_l[2] - (int)local_968) * LVar19 * 8 +
                                    (id_l[1] - (int)local_910) * local_960 + (long)id_l[0] * 8 +
                                    (long)local_780 * -8);
                            }
                            if (bVar4) {
                              *(undefined8 *)(local_7f8 + lVar46 * 8) =
                                   *(undefined8 *)(lVar50 + lVar35 * 8);
                            }
                            dVar56 = dVar56 + *(double *)(local_7f8 + lVar46 * 8);
                            lVar46 = lVar46 + 1;
                            lVar35 = lVar35 + LVar20;
                            puVar48 = puVar48 + lVar7;
                            pdVar38 = pdVar38 + LVar17;
                          } while (lVar46 != 9);
                          lVar35 = 0;
                          pdVar38 = pdVar34;
                          do {
                            *pdVar38 = *(double *)(local_7f8 + lVar35 * 8) * -dVar53 *
                                       (1.0 / dVar56) + *pdVar38;
                            lVar35 = lVar35 + 1;
                            pdVar38 = pdVar38 + LVar17;
                            lVar46 = local_920;
                            uVar47 = local_908;
                            iVar45 = (int)local_918;
                          } while (lVar35 != 9);
                        }
                        lVar28 = lVar28 + 1;
                        uVar36 = uVar36 + 8;
                        pdVar34 = pdVar34 + 1;
                        lVar50 = lVar50 + 8;
                        local_9b8 = local_9b8 + 1;
                        lVar35 = local_8f0;
                      } while (iVar45 != (int)lVar28);
                    }
                    uVar44 = (uint)uVar47;
                    lVar35 = lVar35 + 1;
                    local_978 = local_978 + local_930;
                    local_970 = (double *)((long)local_970 + local_930);
                    local_9b0 = local_9b0 + local_960;
                    local_9c0 = (undefined8 *)((long)local_9c0 + local_928);
                  } while (local_8e0 != (int)lVar35);
                }
                uVar22 = uVar44 + 1;
                this_02 = local_938;
              } while (uVar44 != local_8e4);
            }
          }
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      amrex::MFIter::operator++(&mfi);
      lVar32 = 0;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  if (2 < NavierStokesBase::verbose) {
    dVar53 = amrex::ParallelDescriptor::second();
    poVar31 = amrex::OutStream();
    result.smallend.vect[0] = *(int *)(DAT_00756620 + -0x30);
    this_00 = (ostringstream *)(result.bigend.vect + 1);
    result.smallend.vect[1] = *(int *)(DAT_00756620 + -0x48);
    result.smallend.vect[2] = (int)poVar31;
    result.bigend.vect[0] = (int)((ulong)poVar31 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(undefined8 *)
     ((long)&((IndexType *)(&result.bigend + 1))->itype +
     *(long *)(CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) + -0x18)) =
         *(undefined8 *)
          ((long)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) +
          *(long *)(*(long *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"      PeleLM::adjust_spec_diffusion_fluxes(): lev: ",0x33);
    std::ostream::operator<<(this_00,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", time: ",8);
    std::ostream::_M_insert<double>(dVar53 - dVar52);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&mfi,1);
    amrex::Print::~Print((Print *)&result);
  }
  lVar32 = 0x300;
  do {
    amrex::MultiFab::~MultiFab((MultiFab *)(local_4b8 + lVar32));
    lVar32 = lVar32 + -0x180;
  } while (lVar32 != -0x180);
  if (local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                    super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_998.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
PeleLM::adjust_spec_diffusion_fluxes (MultiFab* const * flux,
                                      const MultiFab&   S,
                                      const BCRec&      bc)
{
   BL_PROFILE("PLM::adjust_spec_diffusion_fluxes()");
   AMREX_ASSERT(S.nGrow() >= 1);
   // Note: S first entry is rho

   //
   // Adjust the species diffusion fluxes so that their sum is zero.
   //
   const Real strt_time = ParallelDescriptor::second();
   const Box& domain = geom.Domain();

#ifdef AMREX_USE_EB
   Vector<BCRec> math_bc(NUM_SPECIES);
   math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

   MultiFab edgstate[AMREX_SPACEDIM];
   int nghost(4);         // TODO Use 4 for now

   for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
   {
     const BoxArray& ba = getEdgeBoxArray(idim);
     edgstate[idim].define(ba, dmap, NUM_SPECIES, nghost, MFInfo(), Factory());
   }
   EB_interp_CellCentroid_to_FaceCentroid(S, AMREX_D_DECL(edgstate[0],edgstate[1],edgstate[2]), 1, 0, NUM_SPECIES, geom, math_bc);
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      for (int dir =0; dir < AMREX_SPACEDIM; ++dir)
      {
         const Box& ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         auto const& rhoY     = S.const_array(mfi,1);
         auto const& flux_dir = flux[dir]->array(mfi);

#ifdef AMREX_USE_EB
         const EBFArrayBox&  state_fab = static_cast<EBFArrayBox const&>(S[mfi]);
         const EBCellFlagFab&    flags = state_fab.getEBCellFlagFab();

         if (flags.getType(amrex::grow(ebx,0)) != FabType::covered )
         {
            // No cut cells in tile + nghost-cell witdh halo -> use non-eb routine
            if (flags.getType(amrex::grow(ebx,nghost)) == FabType::regular )
            {
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
               });
            }
            else
            {
               auto const& rhoYed_d   = edgstate[dir].array(mfi);
               auto const& areafrac_d = areafrac[dir]->array(mfi);
               amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, rhoYed_d, areafrac_d, edomain, bc]
               AMREX_GPU_DEVICE (int i, int j, int k) noexcept
               {
                  int idx[3] = {i,j,k};
                  bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
                  bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
                  repair_flux_eb( i, j, k, dir, on_lo, on_hi, rhoY, rhoYed_d, areafrac_d, flux_dir );
               });
            }
         }
#else
         amrex::ParallelFor(ebx, [dir, rhoY, flux_dir, edomain, bc]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc.lo(dir) == BCType::ext_dir ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc.hi(dir) == BCType::ext_dir ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            repair_flux( i, j, k, dir, on_lo, on_hi, rhoY, flux_dir );
         });

#endif
      }
   }

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::adjust_spec_diffusion_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
   }
}